

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O1

uint32_t *
FastPForLib::packingvector<32U>::unpackmetight<unsigned_int>
          (uint32_t *in,uint *out,size_t outSize,uint32_t bit)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  uint32_t *in_00;
  uint uVar6;
  uint32_t *in_01;
  uint32_t buffer [64];
  uint32_t local_138 [66];
  size_t sVar5;
  
  uVar1 = *in;
  in_01 = in + 1;
  sVar4 = 0;
  uVar2 = (ulong)bit;
  if (0x1f < uVar1) {
    uVar3 = 0;
    do {
      sVar4 = (size_t)(uVar3 + 0x20);
      fastunpack(in_01,out + uVar3,bit);
      in_01 = in_01 + uVar2;
      uVar6 = uVar3 + 0x3f;
      uVar3 = uVar3 + 0x20;
    } while (uVar6 < uVar1);
  }
  uVar3 = (uint)sVar4;
  in_00 = local_138;
  memcpy(in_00,in_01,(ulong)((uVar1 - uVar3) * bit + 0x1f >> 3 & 0xfffffffc));
  sVar5 = sVar4;
  while (sVar5 != outSize) {
    fastunpack(in_00,out + sVar5,bit);
    uVar3 = (int)sVar5 + 0x20;
    in_00 = in_00 + uVar2;
    sVar5 = (size_t)uVar3;
  }
  return (uint32_t *)
         ((long)in_01 +
         ((outSize - sVar4 >> 5) * uVar2 * 4 - (ulong)(((uVar3 - uVar1) * bit >> 5) << 2)));
}

Assistant:

static const uint32_t *unpackmetight(
                                       const uint32_t *in,
                                       IntType * out,
                                       size_t outSize,
                                       const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    uint32_t j = 0;
    for (; j + PACKSIZE - 1 < size; j += PACKSIZE) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE * 2];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (outSize - j) / PACKSIZE * bit;
    for (; j != outSize; j += PACKSIZE) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    return in;
  }